

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

BcOp binop_opcode(Tk binop)

{
  BcOp BVar1;
  
  switch(binop) {
  case 0x2a:
    BVar1 = BC_MUL_LL;
    break;
  case 0x2b:
    BVar1 = BC_ADD_LL;
    break;
  case 0x2c:
  case 0x2e:
switchD_0010f76b_caseD_2c:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                  ,0x176,"BcOp binop_opcode(Tk)");
  case 0x2d:
    BVar1 = BC_SUB_LL;
    break;
  case 0x2f:
    BVar1 = BC_DIV_LL;
    break;
  default:
    switch(binop) {
    case 0x106:
      BVar1 = BC_EQ_LL;
      break;
    case 0x107:
      BVar1 = BC_NEQ_LL;
      break;
    case 0x108:
      BVar1 = BC_LE_LL;
      break;
    case 0x109:
      BVar1 = BC_GE_LL;
      break;
    default:
      if (binop == 0x3c) {
        BVar1 = BC_LT_LL;
      }
      else {
        if (binop != 0x3e) goto switchD_0010f76b_caseD_2c;
        BVar1 = BC_GT_LL;
      }
    }
  }
  return BVar1;
}

Assistant:

static BcOp binop_opcode(Tk binop) {
	switch (binop) {
		// Arithmetic operators
		case '+': return BC_ADD_LL;
		case '-': return BC_SUB_LL;
		case '*': return BC_MUL_LL;
		case '/': return BC_DIV_LL;

		// Relational operators
		case TK_EQ:  return BC_EQ_LL;
		case TK_NEQ: return BC_NEQ_LL;
		case '>':    return BC_GT_LL;
		case TK_GE:  return BC_GE_LL;
		case '<':    return BC_LT_LL;
		case TK_LE:  return BC_LE_LL;

		default: UNREACHABLE();
	}
}